

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtrBasic.c
# Opt level: O1

void Mtr_MakeFirstChild(MtrNode *parent,MtrNode *child)

{
  MtrNode *pMVar1;
  
  child->parent = parent;
  pMVar1 = parent->child;
  child->younger = pMVar1;
  child->elder = (MtrNode *)0x0;
  if (pMVar1 != (MtrNode *)0x0) {
    pMVar1->elder = child;
  }
  parent->child = child;
  return;
}

Assistant:

void
Mtr_MakeFirstChild(
  MtrNode * parent,
  MtrNode * child)
{
    child->parent = parent;
    child->younger = parent->child;
    child->elder = NULL;
    if (parent->child != NULL) {
#ifdef MTR_DEBUG
        assert(parent->child->elder == NULL);
#endif
        parent->child->elder = child;
    }
    parent->child = child;
    return;

}